

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

wchar_t parse_device(dev_t *pdev,archive *a,char *val)

{
  unsigned_long uVar1;
  long local_78;
  char *error;
  dev_t result;
  pack_t *pack;
  char *pcStack_58;
  wchar_t argc;
  char *dev;
  char *p;
  unsigned_long numbers [3];
  char *local_28;
  char *val_local;
  archive *a_local;
  dev_t *pdev_local;
  
  local_78 = 0;
  local_28 = val;
  val_local = (char *)a;
  a_local = (archive *)pdev;
  memset(pdev,0,8);
  pcStack_58 = strchr(local_28,0x2c);
  if (pcStack_58 == (char *)0x0) {
    error = (char *)mtree_atol(&local_28,L'\0');
  }
  else {
    *pcStack_58 = '\0';
    pcStack_58 = pcStack_58 + 1;
    result = (dev_t)pack_find(local_28);
    if ((pack_t_conflict *)result == (pack_t_conflict *)0x0) {
      archive_set_error((archive *)val_local,0x54,"Unknown format `%s\'",local_28);
      return L'\xffffffec';
    }
    pack._4_4_ = 0;
    while (dev = la_strsep(&stack0xffffffffffffffa8,","), dev != (char *)0x0) {
      if (*dev == '\0') {
        archive_set_error((archive *)val_local,0x54,"Missing number");
        return L'\xffffffec';
      }
      if (2 < pack._4_4_) {
        archive_set_error((archive *)val_local,0x54,"Too many arguments");
        return L'\xffffffec';
      }
      uVar1 = mtree_atol(&dev,L'\0');
      numbers[(long)pack._4_4_ + -1] = uVar1;
      pack._4_4_ = pack._4_4_ + 1;
    }
    if (pack._4_4_ < 2) {
      archive_set_error((archive *)val_local,0x54,"Not enough arguments");
      return L'\xffffffec';
    }
    error = (char *)(*(code *)result)(pack._4_4_,&p,&local_78);
    if (local_78 != 0) {
      archive_set_error((archive *)val_local,0x54,"%s",local_78);
      return L'\xffffffec';
    }
  }
  *(char **)a_local = error;
  return L'\0';
}

Assistant:

static int
parse_device(dev_t *pdev, struct archive *a, char *val)
{
#define MAX_PACK_ARGS 3
	unsigned long numbers[MAX_PACK_ARGS];
	char *p, *dev;
	int argc;
	pack_t *pack;
	dev_t result;
	const char *error = NULL;

	memset(pdev, 0, sizeof(*pdev));
	if ((dev = strchr(val, ',')) != NULL) {
		/*
		 * Device's major/minor are given in a specified format.
		 * Decode and pack it accordingly.
		 */
		*dev++ = '\0';
		if ((pack = pack_find(val)) == NULL) {
			archive_set_error(a, ARCHIVE_ERRNO_FILE_FORMAT,
			    "Unknown format `%s'", val);
			return ARCHIVE_WARN;
		}
		argc = 0;
		while ((p = la_strsep(&dev, ",")) != NULL) {
			if (*p == '\0') {
				archive_set_error(a, ARCHIVE_ERRNO_FILE_FORMAT,
				    "Missing number");
				return ARCHIVE_WARN;
			}
			if (argc >= MAX_PACK_ARGS) {
				archive_set_error(a, ARCHIVE_ERRNO_FILE_FORMAT,
				    "Too many arguments");
				return ARCHIVE_WARN;
			}
			numbers[argc++] = (unsigned long)mtree_atol(&p, 0);
		}
		if (argc < 2) {
			archive_set_error(a, ARCHIVE_ERRNO_FILE_FORMAT,
			    "Not enough arguments");
			return ARCHIVE_WARN;
		}
		result = (*pack)(argc, numbers, &error);
		if (error != NULL) {
			archive_set_error(a, ARCHIVE_ERRNO_FILE_FORMAT,
			    "%s", error);
			return ARCHIVE_WARN;
		}
	} else {
		/* file system raw value. */
		result = (dev_t)mtree_atol(&val, 0);
	}
	*pdev = result;
	return ARCHIVE_OK;
#undef MAX_PACK_ARGS
}